

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O0

void __thiscall cmStateSnapshot::InitializeFromParent(cmStateSnapshot *this)

{
  iterator *piVar1;
  StackIter begin;
  StackIter end;
  bool bVar2;
  PointerType pSVar3;
  ReferenceType this_00;
  PointerType pBVar4;
  PointerType pBVar5;
  PointerType pBVar6;
  PointerType pBVar7;
  char *pcVar8;
  PositionType *this_01;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  char *local_90;
  char *include_regex;
  cmLinkedTree<cmDefinitions> *local_78;
  PositionType PStack_70;
  cmLinkedTree<cmDefinitions> *local_68;
  PositionType PStack_60;
  cmDefinitions local_58;
  undefined1 local_20 [8];
  PositionType parent;
  cmStateSnapshot *this_local;
  
  parent.Position = (PositionType)this;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  local_20 = (undefined1  [8])(pSVar3->DirectoryParent).Tree;
  parent.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(pSVar3->DirectoryParent).Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  bVar2 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar3->Vars);
  if (!bVar2) {
    __assert_fail("this->Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x172,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  bVar2 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar3->Vars);
  if (!bVar2) {
    __assert_fail("parent->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmStateSnapshot.cxx"
                  ,0x173,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  local_68 = (pSVar3->Vars).Tree;
  PStack_60 = (pSVar3->Vars).Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  piVar1 = &pSVar3->Root;
  local_78 = piVar1->Tree;
  PStack_70 = (pSVar3->Root).Position;
  end.Tree = piVar1->Tree;
  end.Position = piVar1->Position;
  begin.Position = PStack_60;
  begin.Tree = local_68;
  cmDefinitions::MakeClosure(&local_58,begin,end);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  this_00 = cmLinkedTree<cmDefinitions>::iterator::operator*(&pSVar3->Vars);
  cmDefinitions::operator=(this_00,&local_58);
  cmDefinitions::~cmDefinitions(&local_58);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  this_01 = &this->Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
            (&pBVar4->IncludeDirectories,&pBVar5->IncludeDirectories,
             &pBVar6->IncludeDirectoryBacktraces,&pBVar7->IncludeDirectoryBacktraces,
             &pSVar3->IncludeDirectoryPosition);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
            (&pBVar4->CompileDefinitions,&pBVar5->CompileDefinitions,
             &pBVar6->CompileDefinitionsBacktraces,&pBVar7->CompileDefinitionsBacktraces,
             &pSVar3->CompileDefinitionsPosition);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
            (&pBVar4->CompileOptions,&pBVar5->CompileOptions,&pBVar6->CompileOptionsBacktraces,
             &pBVar7->CompileOptionsBacktraces,&pSVar3->CompileOptionsPosition);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
            (&pBVar4->LinkOptions,&pBVar5->LinkOptions,&pBVar6->LinkOptionsBacktraces,
             &pBVar7->LinkOptionsBacktraces,&pSVar3->LinkOptionsPosition);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_01);
  InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
            (&pBVar4->LinkDirectories,&pBVar5->LinkDirectories,&pBVar6->LinkDirectoriesBacktraces,
             &pBVar7->LinkDirectoriesBacktraces,&pSVar3->LinkDirectoriesPosition);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_20)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"INCLUDE_REGULAR_EXPRESSION",&local_b1);
  pcVar8 = cmPropertyMap::GetPropertyValue(&pBVar4->Properties,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_90 = pcVar8;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"INCLUDE_REGULAR_EXPRESSION",&local_d9);
  cmPropertyMap::SetProperty(&pBVar4->Properties,&local_d8,local_90);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

void cmStateSnapshot::InitializeFromParent()
{
  cmStateDetail::PositionType parent = this->Position->DirectoryParent;
  assert(this->Position->Vars.IsValid());
  assert(parent->Vars.IsValid());

  *this->Position->Vars =
    cmDefinitions::MakeClosure(parent->Vars, parent->Root);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->IncludeDirectories,
    this->Position->BuildSystemDirectory->IncludeDirectories,
    parent->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->IncludeDirectoryPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileDefinitions,
    this->Position->BuildSystemDirectory->CompileDefinitions,
    parent->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->CompileDefinitionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileOptions,
    this->Position->BuildSystemDirectory->CompileOptions,
    parent->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->CompileOptionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->LinkOptions,
    this->Position->BuildSystemDirectory->LinkOptions,
    parent->BuildSystemDirectory->LinkOptionsBacktraces,
    this->Position->BuildSystemDirectory->LinkOptionsBacktraces,
    this->Position->LinkOptionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->LinkDirectories,
    this->Position->BuildSystemDirectory->LinkDirectories,
    parent->BuildSystemDirectory->LinkDirectoriesBacktraces,
    this->Position->BuildSystemDirectory->LinkDirectoriesBacktraces,
    this->Position->LinkDirectoriesPosition);

  const char* include_regex =
    parent->BuildSystemDirectory->Properties.GetPropertyValue(
      "INCLUDE_REGULAR_EXPRESSION");
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", include_regex);
}